

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

char * nlohmann::json_abi_v3_11_3::detail::dtoa_impl::format_buffer
                 (char *buf,int len,int decimal_exponent,int min_exp,int max_exp)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined1 *in_RDI;
  int in_R8D;
  int n;
  int k;
  undefined1 *local_10;
  char *local_8;
  
  iVar1 = in_ESI + in_EDX;
  if ((iVar1 < in_ESI) || (in_R8D < iVar1)) {
    if ((iVar1 < 1) || (in_R8D < iVar1)) {
      if ((in_ECX < iVar1) && (iVar1 < 1)) {
        memmove(in_RDI + (long)-iVar1 + 2,in_RDI,(long)in_ESI);
        *in_RDI = 0x30;
        in_RDI[1] = 0x2e;
        memset(in_RDI + 2,0x30,(long)-iVar1);
        local_8 = in_RDI + (long)-iVar1 + 2 + (long)in_ESI;
      }
      else {
        if (in_ESI == 1) {
          local_10 = in_RDI + 1;
        }
        else {
          memmove(in_RDI + 2,in_RDI + 1,(long)in_ESI - 1);
          in_RDI[1] = 0x2e;
          local_10 = in_RDI + (long)in_ESI + 1;
        }
        *local_10 = 0x65;
        local_8 = append_exponent(local_10 + 1,iVar1 + -1);
      }
    }
    else {
      memmove(in_RDI + (long)iVar1 + 1,in_RDI + iVar1,(long)in_ESI - (long)iVar1);
      in_RDI[iVar1] = 0x2e;
      local_8 = in_RDI + (long)in_ESI + 1;
    }
  }
  else {
    memset(in_RDI + in_ESI,0x30,(long)iVar1 - (long)in_ESI);
    in_RDI[iVar1] = 0x2e;
    in_RDI[iVar1 + 1] = 0x30;
    local_8 = in_RDI + (long)iVar1 + 2;
  }
  return local_8;
}

Assistant:

inline char* format_buffer(char* buf, int len, int decimal_exponent,
                           int min_exp, int max_exp)
{
    JSON_ASSERT(min_exp < 0);
    JSON_ASSERT(max_exp > 0);

    const int k = len;
    const int n = len + decimal_exponent;

    // v = buf * 10^(n-k)
    // k is the length of the buffer (number of decimal digits)
    // n is the position of the decimal point relative to the start of the buffer.

    if (k <= n && n <= max_exp)
    {
        // digits[000]
        // len <= max_exp + 2

        std::memset(buf + k, '0', static_cast<size_t>(n) - static_cast<size_t>(k));
        // Make it look like a floating-point number (#362, #378)
        buf[n + 0] = '.';
        buf[n + 1] = '0';
        return buf + (static_cast<size_t>(n) + 2);
    }

    if (0 < n && n <= max_exp)
    {
        // dig.its
        // len <= max_digits10 + 1

        JSON_ASSERT(k > n);

        std::memmove(buf + (static_cast<size_t>(n) + 1), buf + n, static_cast<size_t>(k) - static_cast<size_t>(n));
        buf[n] = '.';
        return buf + (static_cast<size_t>(k) + 1U);
    }

    if (min_exp < n && n <= 0)
    {
        // 0.[000]digits
        // len <= 2 + (-min_exp - 1) + max_digits10

        std::memmove(buf + (2 + static_cast<size_t>(-n)), buf, static_cast<size_t>(k));
        buf[0] = '0';
        buf[1] = '.';
        std::memset(buf + 2, '0', static_cast<size_t>(-n));
        return buf + (2U + static_cast<size_t>(-n) + static_cast<size_t>(k));
    }

    if (k == 1)
    {
        // dE+123
        // len <= 1 + 5

        buf += 1;
    }
    else
    {
        // d.igitsE+123
        // len <= max_digits10 + 1 + 5

        std::memmove(buf + 2, buf + 1, static_cast<size_t>(k) - 1);
        buf[1] = '.';
        buf += 1 + static_cast<size_t>(k);
    }

    *buf++ = 'e';
    return append_exponent(buf, n - 1);
}